

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O1

bool __thiscall chatra::Thread::callOperator(Thread *this)

{
  pointer *pppVar1;
  pointer pFVar2;
  pointer ppVar3;
  Node *pNVar4;
  ulong uVar5;
  Tuple *tuple;
  TemporaryObject *this_00;
  EvaluateValueResult EVar6;
  vector<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_> local_58;
  Node *local_40;
  int local_34;
  
  pFVar2 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppVar3 = pFVar2[-1].stack.
           super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar4 = ppVar3[-1].first;
  uVar5 = ppVar3[-1].second;
  if (uVar5 < 4) {
    switch(uVar5) {
    case 0:
      ppVar3[-1].second = 1;
      local_40 = (pNVar4->subNodes).
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1].
                 super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      break;
    case 1:
      EVar6 = evaluateValue(this,Value);
      if (EVar6 == Suspend) {
        return false;
      }
      if (EVar6 == StackChanged) {
        return true;
      }
    case 2:
      ppVar3[-1].second = ppVar3[-1].second + 1;
      local_40 = (((pNVar4->subNodes).
                   super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                   ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      break;
    case 3:
      if (pFVar2[-1].values.
          super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>.
          _M_impl.super__Vector_impl_data._M_finish[-1]->hasArgs == false) {
        ppVar3[-1].second = uVar5 + 1;
      }
      else {
        EVar6 = evaluateValue(this,Value);
        if (EVar6 == Suspend) {
          return false;
        }
        if (EVar6 == StackChanged) {
          return true;
        }
      }
      goto LAB_0015eaa6;
    }
    local_34 = 0;
    std::
    vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
    ::emplace_back<chatra::Node*,int>
              ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                *)&pFVar2[-1].stack,&local_40,&local_34);
  }
  else {
LAB_0015eaa6:
    tuple = (Tuple *)((pFVar2[-1].values.
                       super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-2]->targetRef).node)->object;
    checkTupleAsArgOrThrow
              (this,(pNVar4->subNodes).
                    super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                    ._M_impl.super__Vector_impl_data._M_start[1].
                    super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr,tuple);
    this_00 = pFVar2[-1].values.
              super__Vector_base<chatra::TemporaryObject_*,_std::allocator<chatra::TemporaryObject_*>_>
              ._M_impl.super__Vector_impl_data._M_finish[-1];
    pNVar4 = (pNVar4->subNodes).
             super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start[1].
             super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    Tuple::toArgs(&local_58,tuple);
    TemporaryObject::addArgument(this_00,pNVar4,&local_58);
    if (local_58.super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_58.
                      super__Vector_base<chatra::ArgumentSpec,_std::allocator<chatra::ArgumentSpec>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    pppVar1 = &pFVar2[-1].stack.
               super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *pppVar1 = *pppVar1 + -1;
  }
  return true;
}

Assistant:

bool Thread::callOperator() {
	auto& f = frames.back();
	auto* node = f.stack.back().first;
	auto& nodePhase = f.stack.back().second;

	switch (nodePhase) {
	case 0:  nodePhase++;  f.stack.emplace_back(node->subNodes[1].get(), 0);  return true;
	case 1:  CHATRA_EVALUATE_VALUE;
	case 2:  nodePhase++;  f.stack.emplace_back(node->subNodes[0].get(), 0);  return true;
	case 3:
		// To evaluate the case of "foo(...)(...)" which "foo(...)" returns an object
		if (!f.values.back()->hasArguments())
			nodePhase++;
		else
			CHATRA_EVALUATE_VALUE;
	default: {
		auto& tuple = (*(f.values.end() - 2))->getRef().deref<Tuple>();
		checkTupleAsArgOrThrow(node->subNodes[1].get(), tuple);
		f.values.back()->addArgument(node->subNodes[1].get(), tuple.toArgs());
		f.stack.pop_back();
		return true;
	}
	}
}